

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O0

string * expandEsiStr(string *esiStr)

{
  bool bVar1;
  istream *piVar2;
  string *psVar3;
  string *in_RDI;
  int i_1;
  int endR;
  int startR;
  size_type sz;
  size_t found;
  int i;
  string num;
  istringstream ss1;
  size_t *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffddc;
  string local_218 [32];
  int local_1f8;
  int local_1f4;
  string local_1f0 [36];
  int local_1cc;
  long local_1c0;
  int local_1b8;
  string local_1a8 [32];
  istringstream local_188 [384];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::istringstream::istringstream(local_188,(string *)in_RDI,_S_in);
  std::__cxx11::string::string(local_1a8);
  std::__cxx11::string::operator=((string *)local_8,"");
  local_1b8 = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_188,local_1a8,',');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    in_stack_fffffffffffffddc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffddc);
    if (!bVar1) break;
    psVar3 = trim(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    std::__cxx11::string::operator=(local_1a8,(string *)psVar3);
    local_1c0 = std::__cxx11::string::find_first_of((char *)local_1a8,0x1060cf);
    if (local_1c0 == -1) {
      std::__cxx11::string::append((string *)local_8);
      std::__cxx11::string::append((char *)local_8);
    }
    else {
      local_1cc = std::__cxx11::stoi(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0);
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)local_1a8);
      std::__cxx11::string::operator=(local_1a8,local_1f0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::find_first_not_of((char *)local_1a8,0x1060cf);
      std::__cxx11::string::erase((ulong)local_1a8,0);
      local_1f4 = std::__cxx11::stoi(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0);
      for (local_1f8 = local_1cc; psVar3 = local_8, local_1f8 <= local_1f4;
          local_1f8 = local_1f8 + 1) {
        std::__cxx11::to_string(in_stack_fffffffffffffddc);
        std::__cxx11::string::append((string *)psVar3);
        std::__cxx11::string::~string(local_218);
        std::__cxx11::string::append((char *)local_8);
      }
    }
    local_1b8 = local_1b8 + 1;
  }
  psVar3 = rtrim(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
  std::__cxx11::string::operator=((string *)local_8,(string *)psVar3);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::istringstream::~istringstream(local_188);
  return local_8;
}

Assistant:

string& expandEsiStr (string& esiStr) {

    istringstream ss1(esiStr);
    string num;
    esiStr = "";

    int i = 0;

    /* Look at all comma separated ESIs or ESI ranges */
    while (getline(ss1, num, ',')) {

        /* Remove whitespace if any */
        num = trim(num);

        /* Check if its a range */
        std::size_t found = num.find_first_of("-");

        /* If it is a range find start and end of range and enumerate the ESIs
           and append to ESI string */
        if (found!=std::string::npos) {

            std::string::size_type sz;
            int startR = std::stoi (num,&sz);
            num = num.substr(sz);
            num.erase(0, num.find_first_not_of("-"));
            int endR = std::stoi(num,&sz);

            for (int i = startR; i <= endR; i++)
                {
                    esiStr.append(to_string(i));
                    esiStr.append(",");
                }
        }
        /* If it is not a range, append ESI to ESI string */
        else {
            esiStr.append(num);
            esiStr.append(",");
        }
        i++;
    }

    /* Remove trailing comma */
    esiStr = rtrim(esiStr, ",");

    return esiStr;
}